

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreSimplify.cpp
# Opt level: O0

void mathCore::xor_standardizer(expression *a)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference ppeVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  expression *a_00;
  expression *b;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  _Base_ptr p_Var5;
  expression *local_128;
  _Base_ptr local_120;
  expression *local_118;
  _Base_ptr local_110;
  _Base_ptr local_108;
  _Base_ptr local_100;
  _Base_ptr local_f8;
  _Base_ptr local_f0;
  expression *local_e8;
  const_iterator local_e0;
  _Base_ptr local_d8;
  _Base_ptr local_d0;
  _Base_ptr local_c8;
  _Base_ptr local_c0;
  expression *local_b8;
  _Self local_b0 [3];
  _Base_ptr local_98;
  _Base_ptr local_90;
  _Self local_88;
  _Base_ptr local_80;
  _Base_ptr local_78;
  expression *local_70;
  expression *secondNew;
  expression *firstNew;
  expression *second;
  expression *first;
  iterator hintOther;
  iterator iter;
  expSet tempStore;
  expression *a_local;
  
  bVar1 = is_xor(a);
  if (bVar1) {
    std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::multiset
              ((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_> *)&iter);
    std::_Rb_tree_const_iterator<expression_*>::_Rb_tree_const_iterator(&hintOther);
    std::_Rb_tree_const_iterator<expression_*>::_Rb_tree_const_iterator
              ((_Rb_tree_const_iterator<expression_*> *)&first);
    while (sVar3 = std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::size
                             (&a->contents), 2 < sVar3) {
      std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::clear
                ((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_> *)&iter);
      local_78 = (_Base_ptr)
                 std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::begin
                           (&a->contents);
      hintOther._M_node = local_78;
      local_80 = (_Base_ptr)
                 std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::begin
                           ((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_> *)
                            &iter);
      first = (expression *)local_80;
      while( true ) {
        local_88._M_node =
             (_Base_ptr)
             std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::end
                       (&a->contents);
        bVar1 = std::operator!=(&hintOther,&local_88);
        if (!bVar1) break;
        ppeVar4 = std::_Rb_tree_const_iterator<expression_*>::operator*(&hintOther);
        second = *ppeVar4;
        local_98 = hintOther._M_node;
        local_90 = (_Base_ptr)
                   std::multiset<expression*,compareUUID,std::allocator<expression*>>::
                   erase_abi_cxx11_((multiset<expression*,compareUUID,std::allocator<expression*>> *
                                    )&a->contents,hintOther._M_node);
        hintOther._M_node = local_90;
        local_b0[0]._M_node =
             (_Base_ptr)
             std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::end
                       (&a->contents);
        bVar1 = std::operator==(&hintOther,local_b0);
        if (bVar1) {
          local_b8 = first;
          local_c0 = (_Base_ptr)
                     std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::insert
                               ((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>
                                 *)&iter,(const_iterator)first,&second);
        }
        else {
          ppeVar4 = std::_Rb_tree_const_iterator<expression_*>::operator*(&hintOther);
          firstNew = *ppeVar4;
          local_d0 = hintOther._M_node;
          local_c8 = (_Base_ptr)
                     std::multiset<expression*,compareUUID,std::allocator<expression*>>::
                     erase_abi_cxx11_((multiset<expression*,compareUUID,std::allocator<expression*>>
                                       *)&a->contents,hintOther._M_node);
          p_Var5 = hintOther._M_node;
          hintOther._M_node = local_c8;
          iVar2 = copy((EVP_PKEY_CTX *)second,(EVP_PKEY_CTX *)p_Var5);
          secondNew = (expression *)CONCAT44(extraout_var,iVar2);
          iVar2 = copy((EVP_PKEY_CTX *)firstNew,(EVP_PKEY_CTX *)p_Var5);
          local_70 = (expression *)CONCAT44(extraout_var_00,iVar2);
          negate(second);
          negate(firstNew);
          local_e0._M_node = (_Base_ptr)first;
          a_00 = binary_and(second,local_70);
          b = binary_and(secondNew,firstNew);
          local_e8 = binary_or(a_00,b);
          local_d8 = (_Base_ptr)
                     std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::insert
                               ((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>
                                 *)&iter,local_e0,&local_e8);
          first = (expression *)local_d8;
        }
      }
      mergeMultiSet(&a->contents,(expSet *)&iter);
    }
    local_f0 = (_Base_ptr)
               std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::begin
                         (&a->contents);
    hintOther._M_node = local_f0;
    ppeVar4 = std::_Rb_tree_const_iterator<expression_*>::operator*(&hintOther);
    second = *ppeVar4;
    local_100 = hintOther._M_node;
    local_f8 = (_Base_ptr)
               std::multiset<expression*,compareUUID,std::allocator<expression*>>::erase_abi_cxx11_
                         ((multiset<expression*,compareUUID,std::allocator<expression*>> *)
                          &a->contents,hintOther._M_node);
    hintOther._M_node = local_f8;
    ppeVar4 = std::_Rb_tree_const_iterator<expression_*>::operator*(&hintOther);
    firstNew = *ppeVar4;
    local_110 = hintOther._M_node;
    local_108 = (_Base_ptr)
                std::multiset<expression*,compareUUID,std::allocator<expression*>>::erase_abi_cxx11_
                          ((multiset<expression*,compareUUID,std::allocator<expression*>> *)
                           &a->contents,hintOther._M_node);
    p_Var5 = hintOther._M_node;
    hintOther._M_node = local_108;
    iVar2 = copy((EVP_PKEY_CTX *)second,(EVP_PKEY_CTX *)p_Var5);
    secondNew = (expression *)CONCAT44(extraout_var_01,iVar2);
    iVar2 = copy((EVP_PKEY_CTX *)firstNew,(EVP_PKEY_CTX *)p_Var5);
    local_70 = (expression *)CONCAT44(extraout_var_02,iVar2);
    negate(second);
    negate(firstNew);
    local_118 = binary_and(second,local_70);
    local_120 = (_Base_ptr)
                std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::insert
                          (&a->contents,&local_118);
    local_128 = binary_and(secondNew,firstNew);
    std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::insert
              (&a->contents,&local_128);
    trans_or(a);
    std::multiset<expression_*,_compareUUID,_std::allocator<expression_*>_>::~multiset
              ((multiset<expression_*,_compareUUID,_std::allocator<expression_*>_> *)&iter);
  }
  return;
}

Assistant:

void mathCore::xor_standardizer(expression* a) {
	if (mathCore::is_xor(a)) {
		// Just by the number of variables you can grasp how much more complicated this is!
		expSet tempStore;
		expSet::iterator iter, hintOther;
		expression *first, *second, *firstNew, *secondNew;

		// Keep going until there are at most two things in the tree!
		while (a->contents.size() > 2) {
			// Clear the tempStore, Start at the beginning!
			tempStore.clear();
			iter = a->contents.begin();
			hintOther = tempStore.begin();	// Hints to make this crazy slow thing faster!

											// This runs until we are at the end of the expression!
			while (iter != a->contents.end()) {

				first = *iter;
				iter = a->contents.erase(iter); // Remove it from contents, go forward!
				if (iter == a->contents.end()) { // If we have no other pair just insert first into the tempStore and continue!
					tempStore.insert(hintOther, first);
				}
				else {
					second = *iter;		// Pair of first!
					iter = a->contents.erase(iter);	// Keep moving forward!

													// Construct ~a*b + ~b*a !
					firstNew = mathCore::copy(first);
					secondNew = mathCore::copy(second);
					mathCore::negate(first);
					mathCore::negate(second);

					// Hints keep this faster!
					hintOther = tempStore.insert(hintOther,
						// AND OR of AND's!
						mathCore::binary_or(binary_and(first, secondNew), binary_and(firstNew, second)));
				}

			}
			// Now Merge tempStore into a, and continue all over again!
			mergeMultiSet(a->contents, tempStore);
		}

		// Now the XOR has exactly 2 elements!
		iter = a->contents.begin();
		first = *iter;
		iter = a->contents.erase(iter);
		second = *iter;
		iter = a->contents.erase(iter);
		// Remove them and construct the new things which go into the XOR!

		firstNew = mathCore::copy(first);
		secondNew = mathCore::copy(second);
		mathCore::negate(first);
		mathCore::negate(second);

		// Finally insert these last two into the XOR!
		a->contents.insert(binary_and(first, secondNew));
		a->contents.insert(binary_and(firstNew, second));

		// Now we are an OR expression!
		mathCore::trans_or(a);
	}
}